

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  int iVar1;
  bool to_array_00;
  undefined8 uVar2;
  ulong uVar3;
  FieldDescriptor **ppFVar4;
  undefined7 in_register_00000011;
  int i;
  int iVar5;
  long lVar6;
  char *text;
  MessageGenerator *this_00;
  MessageGenerator *pMVar7;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  long lVar8;
  MessageGenerator *pMVar9;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  undefined1 local_68 [12];
  undefined4 local_5c;
  undefined1 local_58 [32];
  ExtensionRange *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,to_array);
  this_00 = (MessageGenerator *)this->descriptor_;
  local_68._0_8_ = anon_unknown_0::SortFieldsByNumber((Descriptor *)this_00);
  local_58._16_8_ = 0;
  local_58._0_8_ = (MessageGenerator *)0x0;
  local_58._8_8_ = (MessageGenerator *)0x0;
  lVar8 = 0;
  lVar6 = 0;
  while( true ) {
    uVar2 = local_58._8_8_;
    pMVar7 = (MessageGenerator *)local_58._0_8_;
    if (*(int *)(this->descriptor_ + 0x58) <= lVar6) break;
    local_38 = (ExtensionRange *)(*(long *)(this->descriptor_ + 0x60) + lVar8);
    this_00 = (MessageGenerator *)local_58;
    std::
    vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
    ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
              ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                *)local_58,&local_38);
    lVar6 = lVar6 + 1;
    lVar8 = lVar8 + 8;
  }
  if (local_58._0_8_ != local_58._8_8_) {
    lVar8 = local_58._8_8_ - local_58._0_8_;
    uVar3 = lVar8 >> 3;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
              (local_58._0_8_,local_58._8_8_,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar8 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
                (pMVar7,uVar2);
      this_00 = pMVar7;
    }
    else {
      pMVar9 = (MessageGenerator *)&pMVar7[1].classname_;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
                (pMVar7,pMVar9);
      for (; this_00 = pMVar7, pMVar9 != (MessageGenerator *)uVar2;
          pMVar9 = (MessageGenerator *)&pMVar9->classname_) {
        pMVar7 = pMVar9;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
                  ();
      }
    }
  }
  iVar5 = 0;
  to_array_00 = (bool)(char)local_5c;
  uVar3 = 0;
LAB_001d6724:
  lVar6 = (long)iVar5;
  uVar3 = (ulong)(int)uVar3;
  do {
    iVar1 = *(int *)(this->descriptor_ + 0x2c);
    if ((iVar1 <= iVar5) && ((ulong)((long)(local_58._8_8_ - local_58._0_8_) >> 3) <= uVar3)) {
      if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
        io::Printer::Print(printer,"if (!unknown_fields().empty()) {\n");
        io::Printer::Indent(printer);
        text = 
        "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
        ;
        if ((char)local_5c != '\0') {
          text = 
          "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
          ;
        }
        io::Printer::Print(printer,text);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      std::
      _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                       *)local_58);
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
                ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68);
      return;
    }
    if (iVar5 == iVar1) {
      GenerateSerializeOneExtensionRange
                (this_00,printer,(ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar3],
                 to_array_00);
    }
    else {
      if (uVar3 == (long)(local_58._8_8_ - local_58._0_8_) >> 3) {
        ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,
                             lVar6);
        this_00 = this;
        GenerateSerializeOneField(this,printer,*ppFVar4,to_array_00);
        goto LAB_001d67db;
      }
      this_00 = (MessageGenerator *)local_68;
      ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,lVar6
                          );
      if (*(int *)(*ppFVar4 + 0x28) <
          ((ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar3])->start) break;
      GenerateSerializeOneExtensionRange
                (this_00,printer,(ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar3],
                 to_array_00);
    }
    uVar3 = uVar3 + 1;
  } while( true );
  ppFVar4 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,lVar6);
  this_00 = this;
  GenerateSerializeOneField(this,printer,*ppFVar4,to_array_00);
LAB_001d67db:
  iVar5 = iVar5 + 1;
  goto LAB_001d6724;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  scoped_array<const FieldDescriptor*> ordered_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeSorter());

  // Merge the fields and the extension ranges, both sorted by field number.
  int i, j;
  for (i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else if (ordered_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    }
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    if (to_array) {
      printer->Print(
        "target = "
            "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
        "    unknown_fields(), target);\n");
    } else {
      printer->Print(
        "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
        "    unknown_fields(), output);\n");
    }
    printer->Outdent();

    printer->Print(
      "}\n");
  }
}